

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electrostatic.cpp
# Opt level: O0

void __thiscall OpenMD::Electrostatic::ReciprocalSpaceSum(Electrostatic *this,RealType *pot)

{
  double dVar1;
  SnapshotManager *pSVar2;
  double *pdVar3;
  reference pvVar4;
  reference pvVar5;
  AtomType *pAVar6;
  reference pvVar7;
  double *in_RSI;
  long in_RDI;
  __type_conflict _Var8;
  double dVar9;
  RealType RVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  RealType qtrq2;
  RealType qtrq1;
  RealType qfrc;
  Atom *atom_4;
  Molecule *mol_4;
  int atid_1;
  Atom *atom_3;
  Molecule *mol_3;
  Atom *atom_2;
  Molecule *mol_2;
  int kk;
  int n;
  int nn;
  int nnn;
  Atom *atom_1;
  Molecule *mol_1;
  int m;
  int mm;
  int mmm;
  int ll;
  int l_1;
  int nMin;
  int mMin;
  Mat3x3d Q;
  Vector3d D;
  RealType qk;
  RealType dk;
  RealType C;
  ElectrostaticAtomData data;
  int atid;
  RealType qkss;
  RealType qkcs;
  RealType dkss;
  RealType dkcs;
  RealType ckss;
  RealType ckcs;
  Mat3x3d Kmat;
  Vector3d Qk;
  Vector3d kVec;
  RealType rn;
  RealType rm;
  RealType rl;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> qxk;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> dxk;
  vector<double,_std::allocator<double>_> qks;
  vector<double,_std::allocator<double>_> qkc;
  vector<double,_std::allocator<double>_> dks;
  vector<double,_std::allocator<double>_> dkc;
  vector<double,_std::allocator<double>_> cks;
  vector<double,_std::allocator<double>_> ckc;
  vector<double,_std::allocator<double>_> skr;
  vector<double,_std::allocator<double>_> ckr;
  vector<double,_std::allocator<double>_> slm;
  vector<double,_std::allocator<double>_> clm;
  RealType rksq;
  RealType expf;
  RealType eksq;
  int l;
  Atom *atom;
  Molecule *mol;
  Vector3d tt;
  Vector3d r;
  int i;
  AtomIterator ai;
  MoleculeIterator mi;
  Vector3d t;
  int j;
  int nMax;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ens;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ems;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  els;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  enc;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  emc;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  elc;
  RealType ralph;
  RealType rvol;
  RealType rcl;
  RealType zcl;
  RealType ycl;
  RealType xcl;
  vector<double,_std::allocator<double>_> AK;
  int kSqLim;
  int kLim2;
  int kLimit;
  int kSqMax;
  int kMax;
  RealType boxMax;
  Vector3d box;
  Mat3x3d hmat;
  RealType eConverter;
  RealType mPoleConverter;
  RealType kVir;
  RealType kPot;
  undefined4 in_stack_fffffffffffff068;
  int in_stack_fffffffffffff06c;
  Molecule *in_stack_fffffffffffff070;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffff078;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffff080;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffff088;
  SimInfo *in_stack_fffffffffffff090;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffff098;
  Vector3<double> *in_stack_fffffffffffff0d0;
  Vector3<double> *in_stack_fffffffffffff0d8;
  Vector3d *in_stack_fffffffffffff0e8;
  value_type vVar17;
  Snapshot *in_stack_fffffffffffff0f0;
  vector<double,_std::allocator<double>_> *this_00;
  SimInfo *local_8d8;
  Molecule *local_8d0;
  RectMatrix<double,_3U,_3U> local_7d8 [3];
  int local_6fc;
  Atom *local_6f8;
  Molecule *local_6f0;
  Atom *local_6e8;
  Molecule *local_6e0;
  int local_678;
  int local_674;
  int local_670;
  int local_66c;
  Atom *local_668;
  Molecule *local_660;
  int local_654;
  int local_650;
  int local_64c;
  int local_648;
  int local_644;
  int local_640;
  int local_63c;
  double local_5d8;
  double local_5d0;
  double local_5c8;
  byte local_5c0;
  byte local_5bf;
  byte local_5be;
  byte local_5bd;
  double local_5b8;
  int local_52c;
  double local_528;
  double local_520;
  double local_518;
  double local_510;
  double local_508;
  double local_500;
  double local_480;
  double local_478;
  double local_470;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_460;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_440;
  undefined8 local_420;
  vector<double,_std::allocator<double>_> local_418;
  undefined8 local_3f8;
  vector<double,_std::allocator<double>_> local_3f0;
  undefined8 local_3d0;
  vector<double,_std::allocator<double>_> local_3c8;
  undefined8 local_3a8;
  vector<double,_std::allocator<double>_> local_3a0;
  undefined8 local_380;
  vector<double,_std::allocator<double>_> local_378;
  undefined8 local_358;
  vector<double,_std::allocator<double>_> local_350;
  undefined8 local_330;
  vector<double,_std::allocator<double>_> local_328;
  undefined8 local_308;
  vector<double,_std::allocator<double>_> local_300;
  undefined8 local_2e0;
  vector<double,_std::allocator<double>_> local_2d8;
  undefined8 local_2b8;
  vector<double,_std::allocator<double>_> local_2b0;
  double local_298;
  double local_290;
  double local_288;
  int local_27c;
  Atom *local_260;
  Molecule *local_258;
  Vector<double,_3U> local_250;
  Vector<double,_3U> local_238;
  int local_21c;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_218;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_210;
  double local_208;
  Vector<double,_3U> local_200;
  Vector<double,_3U> local_1e8;
  int local_1d0;
  uint local_1cc;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_1c8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_1b0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_198;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_180;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_168;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_150;
  double local_138;
  undefined4 local_12c;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  undefined8 local_f8;
  vector<double,_std::allocator<double>_> local_f0;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  undefined4 local_c4;
  double local_c0;
  Vector<double,_3U> local_90 [4];
  undefined8 local_30;
  undefined8 local_28;
  double local_20;
  double local_18;
  double *local_10;
  
  local_18 = 0.0;
  local_20 = 0.0;
  local_28 = 0x3fcaa61cb4c19333;
  local_30 = 0x4074c1053bded360;
  local_10 = in_RSI;
  pSVar2 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 0xf8));
  SnapshotManager::getCurrentSnapshot(pSVar2);
  Snapshot::getHmat((Snapshot *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  SquareMatrix<double,_3>::diagonals((SquareMatrix<double,_3> *)in_stack_fffffffffffff088);
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffff070,
             (Vector<double,_3U> *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  local_c0 = Vector<double,_3U>::max(local_90);
  local_c4 = 7;
  local_d4 = 0x33;
  local_cc = 8;
  local_d0 = 0xf;
  local_f8 = 0;
  local_c8 = local_d4;
  std::allocator<double>::allocator((allocator<double> *)0x410a3c);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090,
             (size_type)in_stack_fffffffffffff088,in_stack_fffffffffffff080._M_current,
             (allocator_type *)in_stack_fffffffffffff078._M_current);
  std::allocator<double>::~allocator((allocator<double> *)0x410a70);
  pdVar3 = Vector3<double>::x((Vector3<double> *)local_90);
  local_108 = 6.283185307179586 / *pdVar3;
  pdVar3 = Vector3<double>::y((Vector3<double> *)local_90);
  local_110 = 6.283185307179586 / *pdVar3;
  pdVar3 = Vector3<double>::z((Vector3<double> *)local_90);
  local_118 = 6.283185307179586 / *pdVar3;
  local_120 = 6.283185307179586 / local_c0;
  pdVar3 = Vector3<double>::x((Vector3<double> *)local_90);
  dVar9 = *pdVar3;
  pdVar3 = Vector3<double>::y((Vector3<double> *)local_90);
  dVar13 = *pdVar3;
  pdVar3 = Vector3<double>::z((Vector3<double> *)local_90);
  local_128 = 6.283185307179586 / (dVar9 * dVar13 * *pdVar3);
  if (1e-12 < *(double *)(in_RDI + 0x2c0) || *(double *)(in_RDI + 0x2c0) == 1e-12) {
    _Var8 = std::pow<double,int>((double)in_stack_fffffffffffff070,in_stack_fffffffffffff06c);
    local_138 = -0.25 / _Var8;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)0x410ca9);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)0x410cb6);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)0x410cc3);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)0x410cd0);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)0x410cdd);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)0x410cea);
    local_1cc = SimInfo::getNAtoms(*(SimInfo **)(in_RDI + 0xf8));
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffff090,(size_type)in_stack_fffffffffffff088);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffff090,(size_type)in_stack_fffffffffffff088);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffff090,(size_type)in_stack_fffffffffffff088);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffff090,(size_type)in_stack_fffffffffffff088);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffff090,(size_type)in_stack_fffffffffffff088);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffff090,(size_type)in_stack_fffffffffffff088);
    for (local_1d0 = 0; local_1d0 < local_cc + 1; local_1d0 = local_1d0 + 1) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](&local_150,(long)local_1d0);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090,
                 (size_type)in_stack_fffffffffffff088);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](&local_168,(long)local_1d0);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090,
                 (size_type)in_stack_fffffffffffff088);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](&local_180,(long)local_1d0);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090,
                 (size_type)in_stack_fffffffffffff088);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](&local_198,(long)local_1d0);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090,
                 (size_type)in_stack_fffffffffffff088);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](&local_1b0,(long)local_1d0);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090,
                 (size_type)in_stack_fffffffffffff088);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](&local_1c8,(long)local_1d0);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090,
                 (size_type)in_stack_fffffffffffff088);
    }
    local_208 = 6.283185307179586;
    Vector<double,_3U>::Vector(&local_200,&local_208);
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_fffffffffffff070,
               (Vector<double,_3U> *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
    Vector<double,_3U>::Vdiv(&local_1e8,&local_1e8,local_90);
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_210)
    ;
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::__normal_iterator(&local_218);
    Vector3<double>::Vector3((Vector3<double> *)0x410f77);
    Vector3<double>::Vector3((Vector3<double> *)0x410f86);
    local_258 = SimInfo::beginMolecule
                          (in_stack_fffffffffffff090,(MoleculeIterator *)in_stack_fffffffffffff088);
    while (local_258 != (Molecule *)0x0) {
      local_260 = Molecule::beginAtom((Molecule *)in_stack_fffffffffffff090,
                                      (iterator *)in_stack_fffffffffffff088);
      while (local_260 != (Atom *)0x0) {
        local_21c = StuntDouble::getLocalIndex(&local_260->super_StuntDouble);
        StuntDouble::getPos((StuntDouble *)in_stack_fffffffffffff078._M_current);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffff070,
                   (Vector3<double> *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068))
        ;
        pSVar2 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 0xf8));
        SnapshotManager::getCurrentSnapshot(pSVar2);
        Snapshot::wrapVector(in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        Vector<double,_3U>::Vmul(&local_250,&local_1e8,&local_238);
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_150,1);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
        *pvVar5 = 1.0;
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_168,1);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
        *pvVar5 = 1.0;
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_180,1);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
        *pvVar5 = 1.0;
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_198,1);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
        *pvVar5 = 0.0;
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_1b0,1);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
        *pvVar5 = 0.0;
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_1c8,1);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
        *pvVar5 = 0.0;
        pdVar3 = Vector3<double>::x((Vector3<double> *)&local_250);
        dVar9 = cos(*pdVar3);
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_150,2);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
        *pvVar5 = dVar9;
        pdVar3 = Vector3<double>::y((Vector3<double> *)&local_250);
        dVar9 = cos(*pdVar3);
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_168,2);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
        *pvVar5 = dVar9;
        pdVar3 = Vector3<double>::z((Vector3<double> *)&local_250);
        dVar9 = cos(*pdVar3);
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_180,2);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
        *pvVar5 = dVar9;
        pdVar3 = Vector3<double>::x((Vector3<double> *)&local_250);
        dVar9 = sin(*pdVar3);
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_198,2);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
        *pvVar5 = dVar9;
        pdVar3 = Vector3<double>::y((Vector3<double> *)&local_250);
        dVar9 = sin(*pdVar3);
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_1b0,2);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
        *pvVar5 = dVar9;
        pdVar3 = Vector3<double>::z((Vector3<double> *)&local_250);
        dVar9 = sin(*pdVar3);
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_1c8,2);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
        *pvVar5 = dVar9;
        for (local_27c = 3; local_27c <= local_cc; local_27c = local_27c + 1) {
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_150,(long)(local_27c + -1));
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          dVar9 = *pvVar5;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_150,2);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          dVar13 = *pvVar5;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_198,(long)(local_27c + -1));
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          dVar14 = *pvVar5;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_198,2);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          dVar1 = *pvVar5;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_150,(long)local_27c);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          *pvVar5 = dVar9 * dVar13 + -(dVar14 * dVar1);
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_168,(long)(local_27c + -1));
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          dVar9 = *pvVar5;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_168,2);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          dVar13 = *pvVar5;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_1b0,(long)(local_27c + -1));
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          dVar14 = *pvVar5;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_1b0,2);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          dVar1 = *pvVar5;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_168,(long)local_27c);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          *pvVar5 = dVar9 * dVar13 + -(dVar14 * dVar1);
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_180,(long)(local_27c + -1));
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          dVar9 = *pvVar5;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_180,2);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          dVar13 = *pvVar5;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_1c8,(long)(local_27c + -1));
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          dVar14 = *pvVar5;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_1c8,2);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          dVar1 = *pvVar5;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_180,(long)local_27c);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          *pvVar5 = dVar9 * dVar13 + -(dVar14 * dVar1);
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_198,(long)(local_27c + -1));
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          dVar9 = *pvVar5;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_150,2);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          dVar13 = *pvVar5;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_150,(long)(local_27c + -1));
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          dVar14 = *pvVar5;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_198,2);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          dVar1 = *pvVar5;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_198,(long)local_27c);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          *pvVar5 = dVar9 * dVar13 + dVar14 * dVar1;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_1b0,(long)(local_27c + -1));
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          dVar9 = *pvVar5;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_168,2);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          dVar13 = *pvVar5;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_168,(long)(local_27c + -1));
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          dVar14 = *pvVar5;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_1b0,2);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          dVar1 = *pvVar5;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_1b0,(long)local_27c);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          *pvVar5 = dVar9 * dVar13 + dVar14 * dVar1;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_1c8,(long)(local_27c + -1));
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          dVar9 = *pvVar5;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_180,2);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          dVar13 = *pvVar5;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_180,(long)(local_27c + -1));
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          dVar14 = *pvVar5;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_1c8,2);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          dVar1 = *pvVar5;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_1c8,(long)local_27c);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_21c);
          *pvVar5 = dVar9 * dVar13 + dVar14 * dVar1;
        }
        local_260 = Molecule::nextAtom((Molecule *)in_stack_fffffffffffff090,
                                       (iterator *)in_stack_fffffffffffff088);
      }
      local_258 = SimInfo::nextMolecule
                            (in_stack_fffffffffffff090,(MoleculeIterator *)in_stack_fffffffffffff088
                            );
    }
    local_288 = 1.0;
    local_290 = 0.0;
    if (local_138 < 0.0) {
      local_290 = exp(local_138 * local_120 * local_120);
    }
    for (local_21c = 1; local_21c <= local_d4; local_21c = local_21c + 1) {
      local_298 = (double)local_21c * local_120 * local_120;
      local_288 = local_290 * local_288;
      dVar9 = (local_288 * 332.0637778) / local_298;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_f0,(long)local_21c);
      *pvVar5 = dVar9;
    }
    local_2b8 = 0;
    std::allocator<double>::allocator((allocator<double> *)0x411d20);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090,
               (size_type)in_stack_fffffffffffff088,in_stack_fffffffffffff080._M_current,
               (allocator_type *)in_stack_fffffffffffff078._M_current);
    std::allocator<double>::~allocator((allocator<double> *)0x411d54);
    local_2e0 = 0;
    std::allocator<double>::allocator((allocator<double> *)0x411d85);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090,
               (size_type)in_stack_fffffffffffff088,in_stack_fffffffffffff080._M_current,
               (allocator_type *)in_stack_fffffffffffff078._M_current);
    std::allocator<double>::~allocator((allocator<double> *)0x411db9);
    local_308 = 0;
    std::allocator<double>::allocator((allocator<double> *)0x411dea);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090,
               (size_type)in_stack_fffffffffffff088,in_stack_fffffffffffff080._M_current,
               (allocator_type *)in_stack_fffffffffffff078._M_current);
    std::allocator<double>::~allocator((allocator<double> *)0x411e1e);
    local_330 = 0;
    std::allocator<double>::allocator((allocator<double> *)0x411e4f);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090,
               (size_type)in_stack_fffffffffffff088,in_stack_fffffffffffff080._M_current,
               (allocator_type *)in_stack_fffffffffffff078._M_current);
    std::allocator<double>::~allocator((allocator<double> *)0x411e83);
    local_358 = 0;
    std::allocator<double>::allocator((allocator<double> *)0x411eb4);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090,
               (size_type)in_stack_fffffffffffff088,in_stack_fffffffffffff080._M_current,
               (allocator_type *)in_stack_fffffffffffff078._M_current);
    std::allocator<double>::~allocator((allocator<double> *)0x411ee8);
    local_380 = 0;
    std::allocator<double>::allocator((allocator<double> *)0x411f19);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090,
               (size_type)in_stack_fffffffffffff088,in_stack_fffffffffffff080._M_current,
               (allocator_type *)in_stack_fffffffffffff078._M_current);
    std::allocator<double>::~allocator((allocator<double> *)0x411f4d);
    local_3a8 = 0;
    std::allocator<double>::allocator((allocator<double> *)0x411f7e);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090,
               (size_type)in_stack_fffffffffffff088,in_stack_fffffffffffff080._M_current,
               (allocator_type *)in_stack_fffffffffffff078._M_current);
    std::allocator<double>::~allocator((allocator<double> *)0x411fb2);
    local_3d0 = 0;
    std::allocator<double>::allocator((allocator<double> *)0x411fe3);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090,
               (size_type)in_stack_fffffffffffff088,in_stack_fffffffffffff080._M_current,
               (allocator_type *)in_stack_fffffffffffff078._M_current);
    std::allocator<double>::~allocator((allocator<double> *)0x412017);
    local_3f8 = 0;
    std::allocator<double>::allocator((allocator<double> *)0x412048);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090,
               (size_type)in_stack_fffffffffffff088,in_stack_fffffffffffff080._M_current,
               (allocator_type *)in_stack_fffffffffffff078._M_current);
    std::allocator<double>::~allocator((allocator<double> *)0x41207c);
    local_420 = 0;
    std::allocator<double>::allocator((allocator<double> *)0x4120ad);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090,
               (size_type)in_stack_fffffffffffff088,in_stack_fffffffffffff080._M_current,
               (allocator_type *)in_stack_fffffffffffff078._M_current);
    std::allocator<double>::~allocator((allocator<double> *)0x4120e1);
    std::allocator<OpenMD::Vector3<double>_>::allocator
              ((allocator<OpenMD::Vector3<double>_> *)0x412106);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffff090,(size_type)in_stack_fffffffffffff088,
               (value_type *)in_stack_fffffffffffff080._M_current,
               (allocator_type *)in_stack_fffffffffffff078._M_current);
    std::allocator<OpenMD::Vector3<double>_>::~allocator
              ((allocator<OpenMD::Vector3<double>_> *)0x412139);
    std::allocator<OpenMD::Vector3<double>_>::allocator
              ((allocator<OpenMD::Vector3<double>_> *)0x41215e);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffff090,(size_type)in_stack_fffffffffffff088,
               (value_type *)in_stack_fffffffffffff080._M_current,
               (allocator_type *)in_stack_fffffffffffff078._M_current);
    std::allocator<OpenMD::Vector3<double>_>::~allocator
              ((allocator<OpenMD::Vector3<double>_> *)0x412191);
    Vector3<double>::Vector3((Vector3<double> *)0x41219e);
    Vector3<double>::Vector3((Vector3<double> *)0x4121ad);
    SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x4121bc);
    ElectrostaticAtomData::ElectrostaticAtomData((ElectrostaticAtomData *)in_stack_fffffffffffff070)
    ;
    Vector3<double>::Vector3((Vector3<double> *)0x4121da);
    SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x4121e9);
    local_63c = local_cc;
    local_640 = local_cc + 1;
    for (local_644 = 1; local_644 <= local_cc; local_644 = local_644 + 1) {
      local_648 = local_644 + -1;
      local_470 = local_108 * (double)local_648;
      for (local_64c = local_63c; local_64c <= local_d0; local_64c = local_64c + 1) {
        local_650 = local_64c - local_cc;
        local_654 = local_650;
        if (local_650 < 1) {
          local_654 = -local_650;
        }
        local_654 = local_654 + 1;
        local_478 = local_110 * (double)local_650;
        local_660 = SimInfo::beginMolecule
                              (in_stack_fffffffffffff090,
                               (MoleculeIterator *)in_stack_fffffffffffff088);
        while (local_660 != (Molecule *)0x0) {
          local_668 = Molecule::beginAtom((Molecule *)in_stack_fffffffffffff090,
                                          (iterator *)in_stack_fffffffffffff088);
          while (local_668 != (Atom *)0x0) {
            local_21c = StuntDouble::getLocalIndex(&local_668->super_StuntDouble);
            if (local_650 < 0) {
              pvVar4 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](&local_150,(long)local_644);
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar4,(long)local_21c);
              dVar9 = *pvVar5;
              pvVar4 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](&local_168,(long)local_654);
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar4,(long)local_21c);
              dVar13 = *pvVar5;
              pvVar4 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](&local_198,(long)local_644);
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar4,(long)local_21c);
              dVar14 = *pvVar5;
              pvVar4 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](&local_1b0,(long)local_654);
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar4,(long)local_21c);
              dVar1 = *pvVar5;
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&local_2b0,(long)local_21c);
              *pvVar5 = dVar9 * dVar13 + dVar14 * dVar1;
              pvVar4 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](&local_198,(long)local_644);
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar4,(long)local_21c);
              dVar9 = *pvVar5;
              pvVar4 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](&local_168,(long)local_654);
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar4,(long)local_21c);
              dVar13 = *pvVar5;
              pvVar4 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](&local_1b0,(long)local_654);
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar4,(long)local_21c);
              dVar14 = *pvVar5;
              pvVar4 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](&local_150,(long)local_644);
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar4,(long)local_21c);
              dVar1 = *pvVar5;
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&local_2d8,(long)local_21c);
              *pvVar5 = dVar9 * dVar13 + -(dVar14 * dVar1);
            }
            else {
              pvVar4 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](&local_150,(long)local_644);
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar4,(long)local_21c);
              dVar9 = *pvVar5;
              pvVar4 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](&local_168,(long)local_654);
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar4,(long)local_21c);
              dVar13 = *pvVar5;
              pvVar4 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](&local_198,(long)local_644);
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar4,(long)local_21c);
              dVar14 = *pvVar5;
              pvVar4 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](&local_1b0,(long)local_654);
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar4,(long)local_21c);
              dVar1 = *pvVar5;
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&local_2b0,(long)local_21c);
              *pvVar5 = dVar9 * dVar13 + -(dVar14 * dVar1);
              pvVar4 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](&local_198,(long)local_644);
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar4,(long)local_21c);
              dVar9 = *pvVar5;
              pvVar4 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](&local_168,(long)local_654);
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar4,(long)local_21c);
              dVar13 = *pvVar5;
              pvVar4 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](&local_1b0,(long)local_654);
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar4,(long)local_21c);
              dVar14 = *pvVar5;
              pvVar4 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](&local_150,(long)local_644);
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar4,(long)local_21c);
              dVar1 = *pvVar5;
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&local_2d8,(long)local_21c);
              *pvVar5 = dVar9 * dVar13 + dVar14 * dVar1;
            }
            local_668 = Molecule::nextAtom((Molecule *)in_stack_fffffffffffff090,
                                           (iterator *)in_stack_fffffffffffff088);
          }
          local_660 = SimInfo::nextMolecule
                                (in_stack_fffffffffffff090,
                                 (MoleculeIterator *)in_stack_fffffffffffff088);
        }
        for (local_66c = local_640; local_66c <= local_d0; local_66c = local_66c + 1) {
          local_670 = local_66c - local_cc;
          local_674 = local_670;
          if (local_670 < 1) {
            local_674 = -local_670;
          }
          local_674 = local_674 + 1;
          local_480 = local_118 * (double)local_670;
          local_678 = local_648 * local_648 + local_650 * local_650 + local_670 * local_670;
          if (local_678 <= local_d4) {
            Vector3<double>::Vector3
                      ((Vector3<double> *)in_stack_fffffffffffff080._M_current,
                       (double)in_stack_fffffffffffff078._M_current,
                       (double)in_stack_fffffffffffff070,
                       (double)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffff070,
                       (Vector3<double> *)
                       CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
            outProduct<double>((Vector3<double> *)in_stack_fffffffffffff098,
                               (Vector3<double> *)in_stack_fffffffffffff090);
            SquareMatrix3<double>::operator=
                      ((SquareMatrix3<double> *)in_stack_fffffffffffff070,
                       (SquareMatrix3<double> *)
                       CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
            SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x412bc8);
            local_6e0 = SimInfo::beginMolecule
                                  (in_stack_fffffffffffff090,
                                   (MoleculeIterator *)in_stack_fffffffffffff088);
            while (local_6e0 != (Molecule *)0x0) {
              local_6e8 = Molecule::beginAtom((Molecule *)in_stack_fffffffffffff090,
                                              (iterator *)in_stack_fffffffffffff088);
              while (local_6e8 != (Atom *)0x0) {
                local_21c = StuntDouble::getLocalIndex(&local_6e8->super_StuntDouble);
                if (local_670 < 0) {
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_2b0,(long)local_21c);
                  dVar9 = *pvVar5;
                  pvVar4 = std::
                           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ::operator[](&local_180,(long)local_674);
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (pvVar4,(long)local_21c);
                  dVar13 = *pvVar5;
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_2d8,(long)local_21c);
                  dVar14 = *pvVar5;
                  pvVar4 = std::
                           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ::operator[](&local_1c8,(long)local_674);
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (pvVar4,(long)local_21c);
                  dVar1 = *pvVar5;
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_300,(long)local_21c);
                  *pvVar5 = dVar9 * dVar13 + dVar14 * dVar1;
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_2d8,(long)local_21c);
                  dVar9 = *pvVar5;
                  pvVar4 = std::
                           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ::operator[](&local_180,(long)local_674);
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (pvVar4,(long)local_21c);
                  dVar13 = *pvVar5;
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_2b0,(long)local_21c);
                  dVar14 = *pvVar5;
                  pvVar4 = std::
                           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ::operator[](&local_1c8,(long)local_674);
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (pvVar4,(long)local_21c);
                  dVar1 = *pvVar5;
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_328,(long)local_21c);
                  *pvVar5 = dVar9 * dVar13 + -(dVar14 * dVar1);
                }
                else {
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_2b0,(long)local_21c);
                  dVar9 = *pvVar5;
                  pvVar4 = std::
                           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ::operator[](&local_180,(long)local_674);
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (pvVar4,(long)local_21c);
                  dVar13 = *pvVar5;
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_2d8,(long)local_21c);
                  dVar14 = *pvVar5;
                  pvVar4 = std::
                           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ::operator[](&local_1c8,(long)local_674);
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (pvVar4,(long)local_21c);
                  dVar1 = *pvVar5;
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_300,(long)local_21c);
                  *pvVar5 = dVar9 * dVar13 + -(dVar14 * dVar1);
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_2d8,(long)local_21c);
                  dVar9 = *pvVar5;
                  pvVar4 = std::
                           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ::operator[](&local_180,(long)local_674);
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (pvVar4,(long)local_21c);
                  dVar13 = *pvVar5;
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_2b0,(long)local_21c);
                  dVar14 = *pvVar5;
                  pvVar4 = std::
                           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ::operator[](&local_1c8,(long)local_674);
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (pvVar4,(long)local_21c);
                  dVar1 = *pvVar5;
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_328,(long)local_21c);
                  *pvVar5 = dVar9 * dVar13 + dVar14 * dVar1;
                }
                local_6e8 = Molecule::nextAtom((Molecule *)in_stack_fffffffffffff090,
                                               (iterator *)in_stack_fffffffffffff088);
              }
              local_6e0 = SimInfo::nextMolecule
                                    (in_stack_fffffffffffff090,
                                     (MoleculeIterator *)in_stack_fffffffffffff088);
            }
            local_6f0 = SimInfo::beginMolecule
                                  (in_stack_fffffffffffff090,
                                   (MoleculeIterator *)in_stack_fffffffffffff088);
            while (local_6f0 != (Molecule *)0x0) {
              local_6f8 = Molecule::beginAtom((Molecule *)in_stack_fffffffffffff090,
                                              (iterator *)in_stack_fffffffffffff088);
              while (local_6f8 != (Atom *)0x0) {
                local_21c = StuntDouble::getLocalIndex(&local_6f8->super_StuntDouble);
                pAVar6 = Atom::getAtomType(local_6f8);
                local_6fc = AtomType::getIdent(pAVar6);
                pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x68),
                                    (long)local_6fc);
                std::
                vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
                ::operator[]((vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
                              *)(in_RDI + 200),(long)*pvVar7);
                ElectrostaticAtomData::operator=
                          ((ElectrostaticAtomData *)in_stack_fffffffffffff070,
                           (ElectrostaticAtomData *)
                           CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
                if ((local_5c0 & 1) != 0) {
                  local_5c8 = local_5b8;
                  if ((local_5bd & 1) != 0) {
                    RVar10 = StuntDouble::getFlucQPos((StuntDouble *)in_stack_fffffffffffff070);
                    local_5c8 = RVar10 + local_5c8;
                  }
                  dVar13 = local_5c8;
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_300,(long)local_21c);
                  dVar9 = *pvVar5;
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_350,(long)local_21c);
                  dVar14 = local_5c8;
                  *pvVar5 = dVar13 * dVar9;
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_328,(long)local_21c);
                  dVar9 = *pvVar5;
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_378,(long)local_21c);
                  *pvVar5 = dVar14 * dVar9;
                }
                if ((local_5bf & 1) != 0) {
                  StuntDouble::getDipole((StuntDouble *)in_stack_fffffffffffff078._M_current);
                  OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffff078._M_current,
                                    (double)in_stack_fffffffffffff070);
                  Vector3<double>::operator=
                            ((Vector3<double> *)in_stack_fffffffffffff078._M_current,
                             (Vector<double,_3U> *)in_stack_fffffffffffff070);
                  local_5d0 = dot<double,3u>((Vector<double,_3U> *)
                                             in_stack_fffffffffffff080._M_current,
                                             (Vector<double,_3U> *)
                                             in_stack_fffffffffffff078._M_current);
                  cross<double>(in_stack_fffffffffffff0d8,in_stack_fffffffffffff0d0);
                  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                  operator[](&local_440,(long)local_21c);
                  Vector3<double>::operator=
                            ((Vector3<double> *)in_stack_fffffffffffff070,
                             (Vector3<double> *)
                             CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
                  dVar13 = local_5d0;
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_300,(long)local_21c);
                  dVar9 = *pvVar5;
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_3a0,(long)local_21c);
                  dVar14 = local_5d0;
                  *pvVar5 = dVar13 * dVar9;
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_328,(long)local_21c);
                  dVar9 = *pvVar5;
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_3c8,(long)local_21c);
                  *pvVar5 = dVar14 * dVar9;
                }
                if ((local_5be & 1) != 0) {
                  StuntDouble::getQuadrupole((StuntDouble *)in_stack_fffffffffffff078._M_current);
                  OpenMD::operator*(in_stack_fffffffffffff088,
                                    (double)in_stack_fffffffffffff080._M_current);
                  SquareMatrix<double,_3>::SquareMatrix
                            ((SquareMatrix<double,_3> *)in_stack_fffffffffffff070,
                             (RectMatrix<double,_3U,_3U> *)
                             CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
                  SquareMatrix3<double>::operator=
                            ((SquareMatrix3<double> *)in_stack_fffffffffffff078._M_current,
                             (SquareMatrix<double,_3> *)in_stack_fffffffffffff070);
                  SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x413556);
                  RectMatrix<double,_3U,_3U>::~RectMatrix(local_7d8);
                  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x413570);
                  OpenMD::operator*(in_stack_fffffffffffff098,
                                    (Vector<double,_3U> *)in_stack_fffffffffffff090);
                  Vector3<double>::operator=
                            ((Vector3<double> *)in_stack_fffffffffffff078._M_current,
                             (Vector<double,_3U> *)in_stack_fffffffffffff070);
                  local_5d8 = dot<double,3u>((Vector<double,_3U> *)
                                             in_stack_fffffffffffff080._M_current,
                                             (Vector<double,_3U> *)
                                             in_stack_fffffffffffff078._M_current);
                  cross<double>(in_stack_fffffffffffff0d8,in_stack_fffffffffffff0d0);
                  OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffff078._M_current);
                  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                  operator[](&local_460,(long)local_21c);
                  Vector3<double>::operator=
                            ((Vector3<double> *)in_stack_fffffffffffff078._M_current,
                             (Vector<double,_3U> *)in_stack_fffffffffffff070);
                  dVar13 = local_5d8;
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_300,(long)local_21c);
                  dVar9 = *pvVar5;
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_3f0,(long)local_21c);
                  dVar14 = local_5d8;
                  *pvVar5 = dVar13 * dVar9;
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_328,(long)local_21c);
                  dVar9 = *pvVar5;
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_418,(long)local_21c);
                  *pvVar5 = dVar14 * dVar9;
                }
                local_6f8 = Molecule::nextAtom((Molecule *)in_stack_fffffffffffff090,
                                               (iterator *)in_stack_fffffffffffff088);
              }
              local_6f0 = SimInfo::nextMolecule
                                    (in_stack_fffffffffffff090,
                                     (MoleculeIterator *)in_stack_fffffffffffff088);
            }
            std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
            std::vector<double,_std::allocator<double>_>::end
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
            local_500 = std::
                        accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                                  (in_stack_fffffffffffff080,in_stack_fffffffffffff078,
                                   (double)in_stack_fffffffffffff070);
            std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
            std::vector<double,_std::allocator<double>_>::end
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
            local_508 = std::
                        accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                                  (in_stack_fffffffffffff080,in_stack_fffffffffffff078,
                                   (double)in_stack_fffffffffffff070);
            std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
            std::vector<double,_std::allocator<double>_>::end
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
            local_510 = std::
                        accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                                  (in_stack_fffffffffffff080,in_stack_fffffffffffff078,
                                   (double)in_stack_fffffffffffff070);
            std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
            std::vector<double,_std::allocator<double>_>::end
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
            local_518 = std::
                        accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                                  (in_stack_fffffffffffff080,in_stack_fffffffffffff078,
                                   (double)in_stack_fffffffffffff070);
            std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
            std::vector<double,_std::allocator<double>_>::end
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
            local_520 = std::
                        accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                                  (in_stack_fffffffffffff080,in_stack_fffffffffffff078,
                                   (double)in_stack_fffffffffffff070);
            std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
            std::vector<double,_std::allocator<double>_>::end
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
            local_528 = std::
                        accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                                  (in_stack_fffffffffffff080,in_stack_fffffffffffff078,
                                   (double)in_stack_fffffffffffff070);
            dVar9 = local_128 + local_128;
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_f0,(long)local_678);
            dVar14 = (local_508 + local_510) - local_528;
            dVar13 = (local_500 - local_518) - local_520;
            local_18 = dVar9 * *pvVar5 * (dVar14 * dVar14 + dVar13 * dVar13) + local_18;
            dVar9 = local_128 + local_128;
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_f0,(long)local_678);
            local_20 = dVar9 * *pvVar5 *
                       ((local_528 * local_528 + local_520 * local_520) * 5.0 +
                       (local_518 * local_520 - local_510 * local_528) * 8.0 +
                       (local_508 * local_528 + local_500 * local_520) * -6.0 +
                       (local_510 * local_510 + local_518 * local_518) * 3.0 +
                       (local_508 * local_510 - local_500 * local_518) * 4.0 +
                       local_500 * local_500 + local_508 * local_508) + local_20;
            local_8d0 = SimInfo::beginMolecule
                                  (in_stack_fffffffffffff090,
                                   (MoleculeIterator *)in_stack_fffffffffffff088);
            while (local_8d0 != (Molecule *)0x0) {
              local_8d8 = (SimInfo *)
                          Molecule::beginAtom((Molecule *)in_stack_fffffffffffff090,
                                              (iterator *)in_stack_fffffffffffff088);
              while (local_8d8 != (SimInfo *)0x0) {
                local_21c = StuntDouble::getLocalIndex((StuntDouble *)local_8d8);
                pAVar6 = Atom::getAtomType((Atom *)local_8d8);
                local_52c = AtomType::getIdent(pAVar6);
                pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x68),
                                    (long)local_52c);
                std::
                vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
                ::operator[]((vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
                              *)(in_RDI + 200),(long)*pvVar7);
                ElectrostaticAtomData::operator=
                          ((ElectrostaticAtomData *)in_stack_fffffffffffff070,
                           (ElectrostaticAtomData *)
                           CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
                this_00 = &local_f0;
                pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (this_00,(long)local_678);
                in_stack_fffffffffffff0d0 = (Vector3<double> *)*pvVar5;
                std::vector<double,_std::allocator<double>_>::operator[](&local_378,(long)local_21c)
                ;
                std::vector<double,_std::allocator<double>_>::operator[](&local_3a0,(long)local_21c)
                ;
                std::vector<double,_std::allocator<double>_>::operator[](&local_418,(long)local_21c)
                ;
                std::vector<double,_std::allocator<double>_>::operator[](&local_350,(long)local_21c)
                ;
                std::vector<double,_std::allocator<double>_>::operator[](&local_3c8,(long)local_21c)
                ;
                std::vector<double,_std::allocator<double>_>::operator[](&local_3f0,(long)local_21c)
                ;
                pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (this_00,(long)local_678);
                vVar17 = *pvVar5;
                pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&local_328,(long)local_21c);
                in_stack_fffffffffffff0d8 = (Vector3<double> *)*pvVar5;
                dVar11 = (local_500 - local_518) - local_520;
                pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&local_300,(long)local_21c);
                dVar9 = *pvVar5;
                dVar15 = (local_508 + local_510) - local_528;
                dVar11 = (double)in_stack_fffffffffffff0d8 * dVar11;
                pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (this_00,(long)local_678);
                dVar13 = *pvVar5;
                pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&local_300,(long)local_21c);
                dVar14 = *pvVar5;
                dVar12 = (local_500 - local_518) - local_520;
                pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&local_328,(long)local_21c);
                dVar1 = *pvVar5;
                dVar16 = (local_508 + local_510) - local_528;
                OpenMD::operator*((double)in_stack_fffffffffffff078._M_current,
                                  (Vector<double,_3U> *)in_stack_fffffffffffff070);
                Vector3<double>::Vector3
                          ((Vector3<double> *)in_stack_fffffffffffff070,
                           (Vector<double,_3U> *)
                           CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
                StuntDouble::addFrc((StuntDouble *)in_stack_fffffffffffff080._M_current,
                                    (Vector3d *)in_stack_fffffffffffff078._M_current);
                if ((local_5bd & 1) != 0) {
                  StuntDouble::addFlucQFrc
                            ((StuntDouble *)in_stack_fffffffffffff080._M_current,
                             (RealType)in_stack_fffffffffffff078._M_current);
                }
                if ((local_5bf & 1) != 0) {
                  in_stack_fffffffffffff098 =
                       (RectMatrix<double,_3U,_3U> *)
                       (local_128 * 4.0 * vVar17 * (dVar11 - dVar9 * dVar15));
                  in_stack_fffffffffffff090 = local_8d8;
                  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                  operator[](&local_440,(long)local_21c);
                  OpenMD::operator*((double)in_stack_fffffffffffff078._M_current,
                                    (Vector<double,_3U> *)in_stack_fffffffffffff070);
                  Vector3<double>::Vector3
                            ((Vector3<double> *)in_stack_fffffffffffff070,
                             (Vector<double,_3U> *)
                             CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
                  StuntDouble::addTrq((StuntDouble *)in_stack_fffffffffffff080._M_current,
                                      (Vector3d *)in_stack_fffffffffffff078._M_current);
                }
                if ((local_5be & 1) != 0) {
                  in_stack_fffffffffffff088 =
                       (RectMatrix<double,_3U,_3U> *)
                       (local_128 * 4.0 * (dVar13 + dVar13) * (dVar14 * dVar12 + dVar1 * dVar16));
                  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                  operator[](&local_460,(long)local_21c);
                  OpenMD::operator*((double)in_stack_fffffffffffff078._M_current,
                                    (Vector<double,_3U> *)in_stack_fffffffffffff070);
                  Vector3<double>::Vector3
                            ((Vector3<double> *)in_stack_fffffffffffff070,
                             (Vector<double,_3U> *)
                             CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
                  StuntDouble::addTrq((StuntDouble *)local_8d8,
                                      (Vector3d *)in_stack_fffffffffffff078._M_current);
                  in_stack_fffffffffffff080._M_current = (double *)local_8d8;
                }
                in_stack_fffffffffffff078._M_current =
                     (double *)
                     Molecule::nextAtom((Molecule *)in_stack_fffffffffffff090,
                                        (iterator *)in_stack_fffffffffffff088);
                local_8d8 = (SimInfo *)in_stack_fffffffffffff078._M_current;
              }
              in_stack_fffffffffffff070 =
                   SimInfo::nextMolecule
                             (in_stack_fffffffffffff090,
                              (MoleculeIterator *)in_stack_fffffffffffff088);
              local_8d0 = in_stack_fffffffffffff070;
            }
          }
        }
        local_640 = 1;
      }
      local_63c = 1;
    }
    *local_10 = local_18 + *local_10;
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x41436e);
    ElectrostaticAtomData::~ElectrostaticAtomData((ElectrostaticAtomData *)0x41437b);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x414388);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffff080._M_current);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffff080._M_current);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff080._M_current);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff080._M_current);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff080._M_current);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff080._M_current);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff080._M_current);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff080._M_current);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff080._M_current);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff080._M_current);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff080._M_current);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff080._M_current);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)in_stack_fffffffffffff080._M_current);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)in_stack_fffffffffffff080._M_current);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)in_stack_fffffffffffff080._M_current);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)in_stack_fffffffffffff080._M_current);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)in_stack_fffffffffffff080._M_current);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)in_stack_fffffffffffff080._M_current);
    local_12c = 0;
  }
  else {
    local_12c = 1;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff080._M_current);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x414497);
  return;
}

Assistant:

void Electrostatic::ReciprocalSpaceSum(RealType& pot) {
    RealType kPot = 0.0;
    RealType kVir = 0.0;
    // Mat3x3d kVirTens(0.0);

    const RealType mPoleConverter = 0.20819434;  // converts from the
                                                 // internal units of
                                                 // Debye (for dipoles)
                                                 // or Debye-angstroms
                                                 // (for quadrupoles) to
                                                 // electron angstroms or
                                                 // electron-angstroms^2

    const RealType eConverter = 332.0637778;  // convert the
                                              // Charge-Charge
                                              // electrostatic
                                              // interactions into kcal /
                                              // mol assuming distances
                                              // are measured in
                                              // angstroms.

    Mat3x3d hmat = info_->getSnapshotManager()->getCurrentSnapshot()->getHmat();
    Vector3d box = hmat.diagonals();
    RealType boxMax = box.max();

    // int kMax = int(2.0 * Constants::PI / (pow(dampingAlpha_,2)*cutoffRadius_
    // * boxMax) );
    int kMax   = 7;
    int kSqMax = kMax * kMax + 2;

    int kLimit = kMax + 1;
    int kLim2  = 2 * kMax + 1;
    int kSqLim = kSqMax;

    vector<RealType> AK(kSqLim + 1, 0.0);
    RealType xcl  = 2.0 * Constants::PI / box.x();
    RealType ycl  = 2.0 * Constants::PI / box.y();
    RealType zcl  = 2.0 * Constants::PI / box.z();
    RealType rcl  = 2.0 * Constants::PI / boxMax;
    RealType rvol = 2.0 * Constants::PI / (box.x() * box.y() * box.z());

    if (dampingAlpha_ < 1.0e-12) return;

    RealType ralph = -0.25 / pow(dampingAlpha_, 2);

    // Calculate and store exponential factors

    vector<vector<RealType>> elc;
    vector<vector<RealType>> emc;
    vector<vector<RealType>> enc;
    vector<vector<RealType>> els;
    vector<vector<RealType>> ems;
    vector<vector<RealType>> ens;

    int nMax = info_->getNAtoms();

    elc.resize(kLimit + 1);
    emc.resize(kLimit + 1);
    enc.resize(kLimit + 1);
    els.resize(kLimit + 1);
    ems.resize(kLimit + 1);
    ens.resize(kLimit + 1);

    for (int j = 0; j < kLimit + 1; j++) {
      elc[j].resize(nMax);
      emc[j].resize(nMax);
      enc[j].resize(nMax);
      els[j].resize(nMax);
      ems[j].resize(nMax);
      ens[j].resize(nMax);
    }

    Vector3d t(2.0 * Constants::PI);
    t.Vdiv(t, box);

    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    int i;
    Vector3d r;
    Vector3d tt;

    for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
         mol           = info_->nextMolecule(mi)) {
      for (Atom* atom = mol->beginAtom(ai); atom != NULL;
           atom       = mol->nextAtom(ai)) {
        i = atom->getLocalIndex();
        r = atom->getPos();
        info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(r);

        tt.Vmul(t, r);

        elc[1][i] = 1.0;
        emc[1][i] = 1.0;
        enc[1][i] = 1.0;
        els[1][i] = 0.0;
        ems[1][i] = 0.0;
        ens[1][i] = 0.0;

        elc[2][i] = cos(tt.x());
        emc[2][i] = cos(tt.y());
        enc[2][i] = cos(tt.z());
        els[2][i] = sin(tt.x());
        ems[2][i] = sin(tt.y());
        ens[2][i] = sin(tt.z());

        for (int l = 3; l <= kLimit; l++) {
          elc[l][i] = elc[l - 1][i] * elc[2][i] - els[l - 1][i] * els[2][i];
          emc[l][i] = emc[l - 1][i] * emc[2][i] - ems[l - 1][i] * ems[2][i];
          enc[l][i] = enc[l - 1][i] * enc[2][i] - ens[l - 1][i] * ens[2][i];
          els[l][i] = els[l - 1][i] * elc[2][i] + elc[l - 1][i] * els[2][i];
          ems[l][i] = ems[l - 1][i] * emc[2][i] + emc[l - 1][i] * ems[2][i];
          ens[l][i] = ens[l - 1][i] * enc[2][i] + enc[l - 1][i] * ens[2][i];
        }
      }
    }

    // Calculate and store AK coefficients:

    RealType eksq = 1.0;
    RealType expf = 0.0;
    if (ralph < 0.0) expf = exp(ralph * rcl * rcl);
    for (i = 1; i <= kSqLim; i++) {
      RealType rksq = float(i) * rcl * rcl;
      eksq          = expf * eksq;
      AK[i]         = eConverter * eksq / rksq;
    }

    /*
     * Loop over all k vectors k = 2 pi (ll/Lx, mm/Ly, nn/Lz)
     * the values of ll, mm and nn are selected so that the symmetry of
     * reciprocal lattice is taken into account i.e. the following
     * rules apply.
     *
     * ll ranges over the values 0 to kMax only.
     *
     * mm ranges over 0 to kMax when ll=0 and over
     *            -kMax to kMax otherwise.
     * nn ranges over 1 to kMax when ll=mm=0 and over
     *            -kMax to kMax otherwise.
     *
     * Hence the result of the summation must be doubled at the end.
     */

    std::vector<RealType> clm(nMax, 0.0);
    std::vector<RealType> slm(nMax, 0.0);
    std::vector<RealType> ckr(nMax, 0.0);
    std::vector<RealType> skr(nMax, 0.0);
    std::vector<RealType> ckc(nMax, 0.0);
    std::vector<RealType> cks(nMax, 0.0);
    std::vector<RealType> dkc(nMax, 0.0);
    std::vector<RealType> dks(nMax, 0.0);
    std::vector<RealType> qkc(nMax, 0.0);
    std::vector<RealType> qks(nMax, 0.0);
    std::vector<Vector3d> dxk(nMax, V3Zero);
    std::vector<Vector3d> qxk(nMax, V3Zero);
    RealType rl, rm, rn;
    Vector3d kVec;
    Vector3d Qk;
    // RealType k2;
    Mat3x3d Kmat;
    RealType ckcs, ckss, dkcs, dkss, qkcs, qkss;
    int atid;
    ElectrostaticAtomData data;
    RealType C, dk, qk;
    Vector3d D;
    Mat3x3d Q;

    int mMin = kLimit;
    int nMin = kLimit + 1;
    for (int l = 1; l <= kLimit; l++) {
      int ll = l - 1;
      rl     = xcl * float(ll);
      for (int mmm = mMin; mmm <= kLim2; mmm++) {
        int mm = mmm - kLimit;
        int m  = abs(mm) + 1;
        rm     = ycl * float(mm);
        // Set temporary products of exponential terms
        for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
             mol           = info_->nextMolecule(mi)) {
          for (Atom* atom = mol->beginAtom(ai); atom != NULL;
               atom       = mol->nextAtom(ai)) {
            i = atom->getLocalIndex();
            if (mm < 0) {
              clm[i] = elc[l][i] * emc[m][i] + els[l][i] * ems[m][i];
              slm[i] = els[l][i] * emc[m][i] - ems[m][i] * elc[l][i];
            } else {
              clm[i] = elc[l][i] * emc[m][i] - els[l][i] * ems[m][i];
              slm[i] = els[l][i] * emc[m][i] + ems[m][i] * elc[l][i];
            }
          }
        }
        for (int nnn = nMin; nnn <= kLim2; nnn++) {
          int nn = nnn - kLimit;
          int n  = abs(nn) + 1;
          rn     = zcl * float(nn);
          // Test on magnitude of k vector:
          int kk = ll * ll + mm * mm + nn * nn;
          if (kk <= kSqLim) {
            kVec = Vector3d(rl, rm, rn);
            // k2     = dot(kVec, kVec);  // length^2 of kVec
            Kmat = outProduct(kVec, kVec);  // kMatrix
            // Calculate exp(ikr) terms
            for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
                 mol           = info_->nextMolecule(mi)) {
              for (Atom* atom = mol->beginAtom(ai); atom != NULL;
                   atom       = mol->nextAtom(ai)) {
                i = atom->getLocalIndex();

                if (nn < 0) {
                  ckr[i] = clm[i] * enc[n][i] + slm[i] * ens[n][i];
                  skr[i] = slm[i] * enc[n][i] - clm[i] * ens[n][i];

                } else {
                  ckr[i] = clm[i] * enc[n][i] - slm[i] * ens[n][i];
                  skr[i] = slm[i] * enc[n][i] + clm[i] * ens[n][i];
                }
              }
            }

            // Calculate scalar and vector products for each site:

            for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
                 mol           = info_->nextMolecule(mi)) {
              for (Atom* atom = mol->beginAtom(ai); atom != NULL;
                   atom       = mol->nextAtom(ai)) {
                i        = atom->getLocalIndex();
                int atid = atom->getAtomType()->getIdent();
                data     = ElectrostaticMap[Etids[atid]];

                if (data.is_Charge) {
                  C = data.fixedCharge;
                  if (data.is_Fluctuating) C += atom->getFlucQPos();
                  ckc[i] = C * ckr[i];
                  cks[i] = C * skr[i];
                }

                if (data.is_Dipole) {
                  D      = atom->getDipole() * mPoleConverter;
                  dk     = dot(D, kVec);
                  dxk[i] = cross(D, kVec);
                  dkc[i] = dk * ckr[i];
                  dks[i] = dk * skr[i];
                }
                if (data.is_Quadrupole) {
                  Q      = atom->getQuadrupole() * mPoleConverter;
                  Qk     = Q * kVec;
                  qk     = dot(kVec, Qk);
                  qxk[i] = -cross(kVec, Qk);
                  qkc[i] = qk * ckr[i];
                  qks[i] = qk * skr[i];
                }
              }
            }

            // calculate vector sums

            ckcs = std::accumulate(ckc.begin(), ckc.end(), 0.0);
            ckss = std::accumulate(cks.begin(), cks.end(), 0.0);
            dkcs = std::accumulate(dkc.begin(), dkc.end(), 0.0);
            dkss = std::accumulate(dks.begin(), dks.end(), 0.0);
            qkcs = std::accumulate(qkc.begin(), qkc.end(), 0.0);
            qkss = std::accumulate(qks.begin(), qks.end(), 0.0);

#ifdef IS_MPI
            MPI_Allreduce(MPI_IN_PLACE, &ckcs, 1, MPI_REALTYPE, MPI_SUM,
                          MPI_COMM_WORLD);
            MPI_Allreduce(MPI_IN_PLACE, &ckss, 1, MPI_REALTYPE, MPI_SUM,
                          MPI_COMM_WORLD);
            MPI_Allreduce(MPI_IN_PLACE, &dkcs, 1, MPI_REALTYPE, MPI_SUM,
                          MPI_COMM_WORLD);
            MPI_Allreduce(MPI_IN_PLACE, &dkss, 1, MPI_REALTYPE, MPI_SUM,
                          MPI_COMM_WORLD);
            MPI_Allreduce(MPI_IN_PLACE, &qkcs, 1, MPI_REALTYPE, MPI_SUM,
                          MPI_COMM_WORLD);
            MPI_Allreduce(MPI_IN_PLACE, &qkss, 1, MPI_REALTYPE, MPI_SUM,
                          MPI_COMM_WORLD);
#endif

            // Accumulate potential energy and virial contribution:

            kPot += 2.0 * rvol * AK[kk] *
                    ((ckss + dkcs - qkss) * (ckss + dkcs - qkss) +
                     (ckcs - dkss - qkcs) * (ckcs - dkss - qkcs));

            kVir +=
                2.0 * rvol * AK[kk] *
                (ckcs * ckcs + ckss * ckss + 4.0 * (ckss * dkcs - ckcs * dkss) +
                 3.0 * (dkcs * dkcs + dkss * dkss) -
                 6.0 * (ckss * qkss + ckcs * qkcs) +
                 8.0 * (dkss * qkcs - dkcs * qkss) +
                 5.0 * (qkss * qkss + qkcs * qkcs));

            // kVirTens += 2 * rvol * AK[kk] *
            //   ( Mat3x3d::identity() - 2.0*( 1.0 / k2 - ralph) * Kmat ) *
            //   (ckcs * ckcs + ckss * ckss + 4.0 * (ckss * dkcs - ckcs * dkss)
            //   +
            //    3.0 * (dkcs * dkcs + dkss * dkss) -
            //    6.0 * (ckss * qkss + ckcs * qkcs) +
            //    8.0 * (dkss * qkcs - dkcs * qkss) +
            //    5.0 * (qkss * qkss + qkcs * qkcs));

            // Calculate force and torque for each site:

            for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
                 mol           = info_->nextMolecule(mi)) {
              for (Atom* atom = mol->beginAtom(ai); atom != NULL;
                   atom       = mol->nextAtom(ai)) {
                i    = atom->getLocalIndex();
                atid = atom->getAtomType()->getIdent();
                data = ElectrostaticMap[Etids[atid]];

                RealType qfrc =
                    AK[kk] *
                    ((cks[i] + dkc[i] - qks[i]) * (ckcs - dkss - qkcs) -
                     (ckc[i] - dks[i] - qkc[i]) * (ckss + dkcs - qkss));
                RealType qtrq1 = AK[kk] * (skr[i] * (ckcs - dkss - qkcs) -
                                           ckr[i] * (ckss + dkcs - qkss));
                RealType qtrq2 = 2.0 * AK[kk] *
                                 (ckr[i] * (ckcs - dkss - qkcs) +
                                  skr[i] * (ckss + dkcs - qkss));

                atom->addFrc(4.0 * rvol * qfrc * kVec);

                if (data.is_Fluctuating) {
                  atom->addFlucQFrc(-2.0 * rvol * qtrq2);
                }

                if (data.is_Dipole) {
                  atom->addTrq(4.0 * rvol * qtrq1 * dxk[i]);
                }
                if (data.is_Quadrupole) {
                  atom->addTrq(4.0 * rvol * qtrq2 * qxk[i]);
                }
              }
            }
          }
        }
        nMin = 1;
      }
      mMin = 1;
    }
    pot += kPot;
    //    virialTensor += kVirTens;
  }